

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O0

IdleDecommitSignal __thiscall Memory::HeapInfo::LeaveIdleDecommit(HeapInfo *this,bool allowTimer)

{
  anon_class_16_2_20d366e1 action;
  IdleDecommitSignal local_18;
  undefined1 local_11;
  IdleDecommitSignal idleDecommitSignal;
  bool allowTimer_local;
  HeapInfo *this_local;
  
  local_18 = IdleDecommitSignal_None;
  action.allowTimer = allowTimer;
  action.idleDecommitSignal = &local_18;
  action._9_7_ = 0;
  local_11 = allowTimer;
  _idleDecommitSignal = this;
  ForEachPageAllocator<Memory::HeapInfo::LeaveIdleDecommit(bool)::__0>(this,action);
  return local_18;
}

Assistant:

IdleDecommitSignal
HeapInfo::LeaveIdleDecommit(bool allowTimer)
{
    IdleDecommitSignal idleDecommitSignal = IdleDecommitSignal_None;
    ForEachPageAllocator([&idleDecommitSignal, allowTimer](IdleDecommitPageAllocator * pageAlloc)
    {
        IdleDecommitSignal signal = pageAlloc->LeaveIdleDecommit(allowTimer);
        idleDecommitSignal = max(idleDecommitSignal, signal);
    });
    return idleDecommitSignal;
}